

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CloneAnnotationForVariable
          (InterfaceVariableScalarReplacement *this,Instruction *annotation_inst,uint32_t var_id)

{
  initializer_list<unsigned_int> init_list;
  Op OVar1;
  IRContext *pIVar2;
  Instruction *__p;
  pointer this_00;
  bool bVar3;
  uint32_t local_64;
  iterator local_60;
  undefined8 local_58;
  SmallVector<unsigned_int,_2UL> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  uint32_t var_id_local;
  Instruction *annotation_inst_local;
  InterfaceVariableScalarReplacement *this_local;
  
  new_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = var_id;
  OVar1 = opt::Instruction::opcode(annotation_inst);
  bVar3 = true;
  if (OVar1 != OpDecorate) {
    OVar1 = opt::Instruction::opcode(annotation_inst);
    bVar3 = true;
    if (OVar1 != OpDecorateId) {
      OVar1 = opt::Instruction::opcode(annotation_inst);
      bVar3 = OVar1 == OpDecorateString;
    }
  }
  if (!bVar3) {
    __assert_fail("annotation_inst->opcode() == spv::Op::OpDecorate || annotation_inst->opcode() == spv::Op::OpDecorateId || annotation_inst->opcode() == spv::Op::OpDecorateString"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x227,
                  "void spvtools::opt::InterfaceVariableScalarReplacement::CloneAnnotationForVariable(Instruction *, uint32_t)"
                 );
  }
  pIVar2 = Pass::context(&this->super_Pass);
  __p = opt::Instruction::Clone(annotation_inst,pIVar2);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_28,__p);
  this_00 = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::operator->(&local_28);
  local_64 = new_inst._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_60 = &local_64;
  local_58 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_60;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
  opt::Instruction::SetInOperand(this_00,0,&local_50);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
  pIVar2 = Pass::context(&this->super_Pass);
  IRContext::AddAnnotationInst(pIVar2,&local_28);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void InterfaceVariableScalarReplacement::CloneAnnotationForVariable(
    Instruction* annotation_inst, uint32_t var_id) {
  assert(annotation_inst->opcode() == spv::Op::OpDecorate ||
         annotation_inst->opcode() == spv::Op::OpDecorateId ||
         annotation_inst->opcode() == spv::Op::OpDecorateString);
  std::unique_ptr<Instruction> new_inst(annotation_inst->Clone(context()));
  new_inst->SetInOperand(0, {var_id});
  context()->AddAnnotationInst(std::move(new_inst));
}